

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void * SettingsHandlerWindow_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImU32 IVar1;
  ImGuiWindowSettings *pIVar2;
  ulong uVar3;
  
  pIVar2 = (ImGuiWindowSettings *)0x0;
  IVar1 = ImHash(name,0,0);
  uVar3 = (ulong)(uint)(GImGui->SettingsWindows).Size;
  if (uVar3 != 0) {
    pIVar2 = (GImGui->SettingsWindows).Data;
    do {
      if (pIVar2->ID == IVar1) goto LAB_00125e05;
      pIVar2 = pIVar2 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    pIVar2 = (ImGuiWindowSettings *)0x0;
  }
LAB_00125e05:
  if (pIVar2 != (ImGuiWindowSettings *)0x0) {
    return pIVar2;
  }
  pIVar2 = ImGui::CreateNewWindowSettings(name);
  return pIVar2;
}

Assistant:

static void* SettingsHandlerWindow_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindWindowSettings(ImHash(name, 0));
    if (!settings)
        settings = ImGui::CreateNewWindowSettings(name);
    return (void*)settings;
}